

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O2

int jpc_bitstream_fillbuf(jpc_bitstream_t *bitstream)

{
  int iVar1;
  jas_stream_t *stream;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((bitstream->openmode_ & 1) == 0) {
    __assert_fail("bitstream->openmode_ & JPC_BITSTREAM_READ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,0xf6,"int jpc_bitstream_fillbuf(jpc_bitstream_t *)");
  }
  if (0 < bitstream->cnt_) {
    __assert_fail("bitstream->cnt_ <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,0xf7,"int jpc_bitstream_fillbuf(jpc_bitstream_t *)");
  }
  uVar3 = bitstream->flags_;
  if ((uVar3 & 4) != 0) {
    bitstream->cnt_ = 0;
    return -1;
  }
  if ((uVar3 & 2) == 0) {
    uVar5 = (ulong)(((uint)bitstream->buf_ & 0xff) << 8);
    bitstream->buf_ = uVar5;
    stream = bitstream->stream_;
    if ((stream->flags_ & 7U) == 0) {
      if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
        iVar1 = stream->cnt_;
        stream->cnt_ = iVar1 + -1;
        if (0 < iVar1) {
          stream->rwcnt_ = stream->rwcnt_ + 1;
          pbVar2 = stream->ptr_;
          stream->ptr_ = pbVar2 + 1;
          uVar3 = (uint)*pbVar2;
LAB_00118a81:
          uVar4 = uVar5 == 0xff00 ^ 7;
          bitstream->cnt_ = uVar4;
          uVar5 = (2 << (sbyte)uVar4) - 1U & uVar3 | uVar5;
          bitstream->buf_ = uVar5;
          return (uint)(((uint)uVar5 >> uVar4 & 1) != 0);
        }
        uVar3 = jas_stream_fillbuf(stream,1);
        if (uVar3 != 0xffffffff) {
          uVar5 = bitstream->buf_;
          goto LAB_00118a81;
        }
        uVar3 = bitstream->flags_;
      }
      else {
        stream->flags_ = stream->flags_ | 4;
      }
    }
    bitstream->flags_ = uVar3 | 2;
  }
  else {
    bitstream->buf_ = 0x7f;
    bitstream->cnt_ = 7;
  }
  return 1;
}

Assistant:

int jpc_bitstream_fillbuf(jpc_bitstream_t *bitstream)
{
	int c;
	/* Note: The count has already been decremented by the caller. */
	assert(bitstream->openmode_ & JPC_BITSTREAM_READ);
	assert(bitstream->cnt_ <= 0);

	if (bitstream->flags_ & JPC_BITSTREAM_ERR) {
		bitstream->cnt_ = 0;
		return -1;
	}

	if (bitstream->flags_ & JPC_BITSTREAM_EOF) {
		bitstream->buf_ = 0x7f;
		bitstream->cnt_ = 7;
		return 1;
	}

	bitstream->buf_ = (bitstream->buf_ << 8) & 0xffff;
	if ((c = jas_stream_getc((bitstream)->stream_)) == EOF) {
		bitstream->flags_ |= JPC_BITSTREAM_EOF;
		return 1;
	}
	bitstream->cnt_ = (bitstream->buf_ == 0xff00) ? 6 : 7;
	bitstream->buf_ |= c & ((1 << (bitstream->cnt_ + 1)) - 1);
	return (bitstream->buf_ >> bitstream->cnt_) & 1;
}